

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake2plus.cc
# Opt level: O3

bool __thiscall
bssl::spake2plus::Verifier::ProcessProverShare
          (Verifier *this,Span<unsigned_char> out_share,Span<unsigned_char> out_confirm,
          Span<unsigned_char> out_secret,Span<const_unsigned_char> prover_share)

{
  EC_SCALAR *scalar;
  EC_SCALAR *scalar_00;
  bool bVar1;
  int iVar2;
  EC_GROUP *group;
  size_t sVar3;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  EC_JACOBIAN tmp;
  EC_AFFINE Z;
  EC_AFFINE X;
  EC_JACOBIAN r2;
  EC_AFFINE Y;
  EC_JACOBIAN X_j;
  EC_JACOBIAN N_j;
  EC_JACOBIAN M_j;
  EC_JACOBIAN r;
  EC_JACOBIAN l;
  EC_AFFINE V;
  EC_JACOBIAN L_j;
  EC_JACOBIAN T;
  EC_JACOBIAN Y_j;
  
  sVar3 = out_confirm.size_;
  if ((((this->state_ != kInit) || (out_share.size_ != 0x41)) || (sVar3 != 0x20)) ||
     ((out_secret.size_ != 0x20 || (prover_share.size_ != 0x41)))) {
    iVar2 = 0x19c;
    goto LAB_001a2819;
  }
  group = EC_group_p256();
  in.size_ = sVar3;
  in.data_ = (uchar *)0x41;
  anon_unknown_0::ConstantToJacobian
            ((anon_unknown_0 *)group,(EC_GROUP *)&M_j,(EC_JACOBIAN *)(anonymous_namespace)::kM_bytes
             ,in);
  in_00.size_ = sVar3;
  in_00.data_ = (uchar *)0x41;
  anon_unknown_0::ConstantToJacobian
            ((anon_unknown_0 *)group,(EC_GROUP *)&N_j,(EC_JACOBIAN *)(anonymous_namespace)::kN_bytes
             ,in_00);
  scalar_00 = &this->y_;
  iVar2 = ec_point_mul_scalar_base(group,&l,scalar_00);
  if (iVar2 != 0) {
    scalar = &this->w0_;
    iVar2 = ec_point_mul_scalar(group,&r,&N_j,scalar);
    if (iVar2 != 0) {
      (*group->meth->add)(group,&Y_j,&l,&r);
      iVar2 = ec_jacobian_to_affine(group,&Y,&Y_j);
      if (iVar2 == 0) {
        iVar2 = 0x1b2;
      }
      else {
        sVar3 = ec_point_to_bytes(group,&Y,POINT_CONVERSION_UNCOMPRESSED,out_share.data_,0x41);
        if (sVar3 != 0x41) {
          abort();
        }
        iVar2 = ec_point_from_uncompressed(group,&X,prover_share.data_,0x41);
        if ((iVar2 == 0) || (iVar2 = ec_point_mul_scalar(group,&r2,&M_j,scalar), iVar2 == 0)) {
          iVar2 = 0x1bf;
        }
        else {
          ec_felem_neg(group,&r2.Y,&r2.Y);
          ec_affine_to_jacobian(group,&X_j,&X);
          (*group->meth->add)(group,&T,&X_j,&r2);
          iVar2 = ec_point_mul_scalar(group,&tmp,&T,scalar_00);
          if ((iVar2 == 0) || (iVar2 = ec_jacobian_to_affine(group,&Z,&tmp), iVar2 == 0)) {
            iVar2 = 0x1cf;
          }
          else {
            ec_affine_to_jacobian(group,&L_j,&this->L_);
            iVar2 = ec_point_mul_scalar(group,&tmp,&L_j,scalar_00);
            if (iVar2 != 0) {
              iVar2 = ec_jacobian_to_affine(group,&V,&tmp);
              if (iVar2 != 0) {
                bVar1 = anon_unknown_0::ComputeTranscript
                                  (this->confirm_,out_confirm.data_,out_secret.data_,
                                   prover_share.data_,out_share.data_,&this->transcript_hash_,&Z,&V,
                                   scalar);
                if (bVar1) {
                  this->state_ = kProverShareSeen;
                  return true;
                }
                iVar2 = 0x1df;
                goto LAB_001a2819;
              }
            }
            iVar2 = 0x1d8;
          }
        }
      }
      goto LAB_001a2819;
    }
  }
  iVar2 = 0x1aa;
LAB_001a2819:
  ERR_put_error(0xe,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/spake2plus/spake2plus.cc"
                ,iVar2);
  return false;
}

Assistant:

bool Verifier::ProcessProverShare(Span<uint8_t> out_share,
                                  Span<uint8_t> out_confirm,
                                  Span<uint8_t> out_secret,
                                  Span<const uint8_t> prover_share) {
  if (state_ != State::kInit ||  //
      out_share.size() != kShareSize || out_confirm.size() != kConfirmSize ||
      out_secret.size() != kSecretSize || prover_share.size() != kShareSize) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const EC_GROUP *group = EC_group_p256();
  EC_JACOBIAN l, r, M_j, N_j;
  ConstantToJacobian(group, &M_j, kM_bytes);
  ConstantToJacobian(group, &N_j, kN_bytes);

  // Compute Y = y×P + w0×M.
  // TODO(crbug.com/383778231): This could be sped up with a constant-time,
  // two-point multiplication.
  if (!ec_point_mul_scalar_base(group, &l, &y_) ||
      !ec_point_mul_scalar(group, &r, &N_j, &w0_)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  EC_JACOBIAN Y_j;
  EC_AFFINE Y;
  group->meth->add(group, &Y_j, &l, &r);
  if (!ec_jacobian_to_affine(group, &Y, &Y_j)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const size_t written = ec_point_to_bytes(
      group, &Y, POINT_CONVERSION_UNCOMPRESSED, out_share.data(), kShareSize);
  BSSL_CHECK(written == kShareSize);

  EC_JACOBIAN r2;
  EC_AFFINE X;
  if (!ec_point_from_uncompressed(group, &X, prover_share.data(),
                                  prover_share.size()) ||
      !ec_point_mul_scalar(group, &r2, &M_j, &w0_)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  ec_felem_neg(group, &r2.Y, &r2.Y);

  EC_JACOBIAN X_j, T;
  ec_affine_to_jacobian(group, &X_j, &X);
  group->meth->add(group, &T, &X_j, &r2);

  // TODO(crbug.com/383778231): The two affine conversions could be batched
  // together.
  EC_JACOBIAN tmp;
  EC_AFFINE Z;
  if (!ec_point_mul_scalar(group, &tmp, &T, &y_) ||  //
      !ec_jacobian_to_affine(group, &Z, &tmp)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  EC_JACOBIAN L_j;
  EC_AFFINE V;
  ec_affine_to_jacobian(group, &L_j, &L_);
  if (!ec_point_mul_scalar(group, &tmp, &L_j, &y_) ||  //
      !ec_jacobian_to_affine(group, &V, &tmp)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  if (!ComputeTranscript(confirm_, out_confirm.data(), out_secret.data(),
                         prover_share.data(), out_share.data(),
                         &transcript_hash_, &Z, &V, &w0_)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_INTERNAL_ERROR);
    return false;
  }

  state_ = State::kProverShareSeen;
  return true;
}